

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::ReadDependentFile(cmMakefile *this,char *filename,bool noPolicyScope)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_128 [8];
  cmParseFileScope pfs;
  cmListFile listFile;
  IncludeScope incScope;
  string local_c8;
  undefined1 local_a8 [8];
  string filenametoread;
  string local_80;
  allocator local_49;
  string local_48;
  byte local_21;
  char *pcStack_20;
  bool noPolicyScope_local;
  char *filename_local;
  cmMakefile *this_local;
  
  local_21 = noPolicyScope;
  pcStack_20 = filename;
  filename_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"CMAKE_PARENT_LIST_FILE",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_80,"CMAKE_CURRENT_LIST_FILE",
             (allocator *)(filenametoread.field_2._M_local_buf + 0xf));
  pcVar2 = GetDefinition(this,&local_80);
  AddDefinition(this,&local_48,pcVar2);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)(filenametoread.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  pcVar2 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,pcVar2,(allocator *)&incScope.field_0xf);
  pcVar2 = GetCurrentSourceDirectory(this);
  cmsys::SystemTools::CollapseFullPath((string *)local_a8,&local_c8,pcVar2);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&incScope.field_0xf);
  IncludeScope::IncludeScope
            ((IncludeScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,this,(string *)local_a8,(bool)(local_21 & 1)
            );
  cmListFile::cmListFile((cmListFile *)&pfs.Context.Line);
  cmParseFileScope::cmParseFileScope((cmParseFileScope *)local_128,this);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmListFile::ParseFile((cmListFile *)&pfs.Context.Line,pcVar2,false,this);
  if (!bVar1) {
    this_local._7_1_ = 0;
  }
  cmParseFileScope::~cmParseFileScope((cmParseFileScope *)local_128);
  if (bVar1) {
    ReadListFile(this,(cmListFile *)&pfs.Context.Line,(string *)local_a8);
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    if (bVar1) {
      IncludeScope::Quiet((IncludeScope *)
                          &listFile.Functions.
                           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    this_local._7_1_ = 1;
  }
  cmListFile::~cmListFile((cmListFile *)&pfs.Context.Line);
  IncludeScope::~IncludeScope
            ((IncludeScope *)
             &listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::ReadDependentFile(const char* filename, bool noPolicyScope)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE",
                      this->GetDefinition("CMAKE_CURRENT_LIST_FILE"));
  std::string filenametoread =
    cmSystemTools::CollapseFullPath(filename,
                                    this->GetCurrentSourceDirectory());

  IncludeScope incScope(this, filenametoread, noPolicyScope);

  cmListFile listFile;
  {
  cmParseFileScope pfs(this);
  if (!listFile.ParseFile(filenametoread.c_str(), false, this))
    {
    return false;
    }
  }

  this->ReadListFile(listFile, filenametoread);
  if(cmSystemTools::GetFatalErrorOccured())
    {
    incScope.Quiet();
    }
  return true;
}